

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_manager.cpp
# Opt level: O3

int __thiscall
libtorrent::aux::bandwidth_manager::request_bandwidth
          (bandwidth_manager *this,shared_ptr<libtorrent::aux::bandwidth_socket> *peer,int blk,
          int priority,span<libtorrent::aux::bandwidth_channel_*> channels)

{
  bandwidth_channel *pbVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  bw_request bwr;
  shared_ptr<libtorrent::aux::bandwidth_socket> local_a8;
  bw_request local_90;
  
  iVar3 = 0;
  if ((this->m_abort == false) && (iVar3 = blk, channels.m_len != 0)) {
    local_a8.super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (peer->
             super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_a8.super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (peer->super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    (peer->super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peer->super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = (element_type *)0x0;
    bw_request::bw_request(&local_90,&local_a8,blk,priority);
    if (local_a8.super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.
                 super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar2 = 0;
    iVar3 = 0;
    do {
      pbVar1 = *(bandwidth_channel **)((long)channels.m_ptr + lVar2);
      lVar4 = pbVar1->m_quota_left - (long)blk;
      if (lVar4 < pbVar1->m_limit) {
        lVar4 = (long)iVar3;
        iVar3 = iVar3 + 1;
        local_90.channel.super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems[lVar4] =
             pbVar1;
      }
      else {
        pbVar1->m_quota_left = lVar4;
      }
      lVar2 = lVar2 + 8;
    } while (channels.m_len << 3 != lVar2);
    if (iVar3 != 0) {
      this->m_queued_bytes = this->m_queued_bytes + (long)blk;
      blk = 0;
      ::std::vector<libtorrent::aux::bw_request,_std::allocator<libtorrent::aux::bw_request>_>::
      emplace_back<libtorrent::aux::bw_request>(&this->m_queue,&local_90);
    }
    iVar3 = blk;
    if (local_90.peer.
        super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.peer.
                 super___shared_ptr<libtorrent::aux::bandwidth_socket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return iVar3;
}

Assistant:

int bandwidth_manager::request_bandwidth(std::shared_ptr<bandwidth_socket> peer
		, int const blk, int const priority, span<bandwidth_channel*> channels)
	{
		INVARIANT_CHECK;
		if (m_abort) return 0;

		TORRENT_ASSERT(blk > 0);
		TORRENT_ASSERT(priority > 0);

		// if this assert is hit, the peer is requesting more bandwidth before
		// being assigned bandwidth for an already outstanding request
		TORRENT_ASSERT(!is_queued(peer.get()));

		if (channels.empty())
		{
			// the connection is not rate limited by any of its
			// bandwidth channels, or it doesn't belong to any
			// channels. There's no point in adding it to
			// the queue, just satisfy the request immediately
			return blk;
		}

		int k = 0;
		bw_request bwr(std::move(peer), blk, priority);
		for (auto const& c : channels)
		{
			if (c->need_queueing(blk))
				bwr.channel[k++] = c;
		}

		if (k == 0) return blk;

		m_queued_bytes += blk;
		m_queue.push_back(std::move(bwr));
		return 0;
	}